

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_reference_finite_element.h
# Opt level: O3

size_type __thiscall
lf::fe::ScalarReferenceFiniteElement<double>::NumRefShapeFunctions
          (ScalarReferenceFiniteElement<double> *this)

{
  int iVar1;
  size_type sVar2;
  dim_t dVar3;
  uint sub_codim;
  uint uVar4;
  ulong uVar5;
  size_type sVar6;
  RefEl local_29;
  
  iVar1 = (*this->_vptr_ScalarReferenceFiniteElement[2])();
  base::internal::DimensionImpl((RefElType)iVar1);
  sub_codim = 0;
  sVar6 = 0;
  do {
    iVar1 = (*this->_vptr_ScalarReferenceFiniteElement[2])(this);
    local_29.type_ = (RefElType)iVar1;
    sVar2 = base::RefEl::NumSubEntities(&local_29,sub_codim);
    if (sVar2 != 0) {
      uVar5 = 0;
      do {
        iVar1 = (*this->_vptr_ScalarReferenceFiniteElement[6])(this,(ulong)sub_codim,uVar5);
        sVar6 = sVar6 + iVar1;
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
        iVar1 = (*this->_vptr_ScalarReferenceFiniteElement[2])(this);
        local_29.type_ = (RefElType)iVar1;
        sVar2 = base::RefEl::NumSubEntities(&local_29,sub_codim);
      } while (uVar4 < sVar2);
    }
    sub_codim = sub_codim + 1;
    iVar1 = (*this->_vptr_ScalarReferenceFiniteElement[2])(this);
    dVar3 = base::internal::DimensionImpl((RefElType)iVar1);
  } while (sub_codim <= dVar3);
  return sVar6;
}

Assistant:

[[nodiscard]] virtual size_type NumRefShapeFunctions() const {
    size_type cnt = 0;
    for (dim_t codim = 0; codim <= Dimension(); ++codim) {
      for (sub_idx_t subidx = 0; subidx < RefEl().NumSubEntities(codim);
           ++subidx) {
        cnt += NumRefShapeFunctions(codim, subidx);
      }
    }
    return cnt;
  }